

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

pair<ParserProbModelXML::elm_type,_unsigned_int> __thiscall
ParserProbModelXML::GetParsedElement(ParserProbModelXML *this,string *name)

{
  bool bVar1;
  char *__rhs;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
  *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  _Self local_28;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0xa84722);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = std::operator==(local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>
                           *)0xa8482a);
    return ppVar2->second;
  }
  __rhs = (char *)__cxa_allocate_exception(0x28);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(in_RSI,__rhs);
  EParse::EParse((EParse *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __cxa_throw(__rhs,&EParse::typeinfo,EParse::~EParse);
}

Assistant:

const std::pair<ParserProbModelXML::elm_type, Index> ParserProbModelXML::GetParsedElement(const std::string name) const
{
    map<string, pair<elm_type, Index> >::const_iterator it = _m_parsedElements.find(name);

    if(it == _m_parsedElements.end())
    {
        throw EParse("Requested undefined variable \"" + name + "\".");
    }

    return it->second;
}